

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O2

int do_zlib(zbuf *a,char *obuf,int olen,int exp,int parse_header)

{
  zhuffman *z;
  zhuffman *z_00;
  char cVar1;
  char *pcVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  byte *pbVar8;
  ulong uVar9;
  uint8 *puVar10;
  char *pcVar11;
  uint8 uVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  uint8 local_218 [31];
  byte bStack_1f9;
  uint8 lencodes [455];
  
  a->zout_start = obuf;
  a->zout = obuf;
  a->zout_end = obuf + olen;
  a->z_expandable = exp;
  if (parse_header != 0) {
    pbVar8 = a->zbuffer;
    uVar3 = 0;
    if (pbVar8 < a->zbuffer_end) {
      a->zbuffer = pbVar8 + 1;
      uVar4 = (uint)*pbVar8;
      pbVar8 = pbVar8 + 1;
    }
    else {
      uVar4 = 0;
    }
    if (pbVar8 < a->zbuffer_end) {
      a->zbuffer = pbVar8 + 1;
      uVar3 = (uint)*pbVar8;
    }
    if ((((uVar3 & 0x20) != 0) || ((short)((uVar4 << 8 | uVar3) % 0x1f) != 0)) ||
       ((uVar4 & 0xf) != 8)) {
LAB_0014ae45:
      failure_reason = "Corrupt PNG";
      return 0;
    }
  }
  a->num_bits = 0;
  a->code_buffer = 0;
  z = &a->z_length;
  z_00 = &a->z_distance;
LAB_0014a9b0:
  uVar3 = zreceive(a,1);
  uVar4 = zreceive(a,2);
  if (uVar4 != 0) {
    if (uVar4 != 1) {
      if (uVar4 == 3) {
        return 0;
      }
      uVar4 = zreceive(a,5);
      uVar5 = zreceive(a,5);
      uVar6 = zreceive(a,4);
      local_218[0] = '\0';
      local_218[1] = '\0';
      local_218[2] = '\0';
      local_218[3] = '\0';
      local_218[4] = '\0';
      local_218[5] = '\0';
      local_218[6] = '\0';
      local_218[7] = '\0';
      local_218[8] = '\0';
      local_218[9] = '\0';
      local_218[10] = '\0';
      local_218[0xb] = '\0';
      local_218[0xc] = '\0';
      local_218[0xd] = '\0';
      local_218[0xe] = '\0';
      local_218[0xf] = '\0';
      local_218[0x10] = '\0';
      local_218[0x11] = '\0';
      local_218[0x12] = '\0';
      uVar9 = (ulong)(uVar6 + 4);
      if ((int)(uVar6 + 4) < 1) {
        uVar9 = 0;
      }
      for (uVar16 = 0; uVar9 != uVar16; uVar16 = uVar16 + 1) {
        uVar6 = zreceive(a,3);
        local_218[(byte)(&compute_huffman_codes_length_dezigzag)[uVar16]] = (uint8)uVar6;
      }
      iVar7 = zbuild_huffman((zhuffman *)compute_huffman_codes_z_codelength,local_218,0x13);
      if (iVar7 == 0) {
        return 0;
      }
      iVar14 = uVar4 + 0x101;
      iVar15 = iVar14 + uVar5 + 1;
      iVar7 = 0;
LAB_0014aace:
      do {
        if (iVar15 <= iVar7) goto LAB_0014ac5d;
        uVar4 = zhuffman_decode(a,(zhuffman *)compute_huffman_codes_z_codelength);
        if (0x12 < uVar4) {
          __assert_fail("c >= 0 && c < 19",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sidneydijkstra[P]SDEN/external/soil/src/stb_image_aug.c"
                        ,0x72d,"int compute_huffman_codes(zbuf *)");
        }
        if (uVar4 < 0x10) {
          lencodes[iVar7] = (uint8)uVar4;
          iVar7 = iVar7 + 1;
          goto LAB_0014aace;
        }
        if (uVar4 == 0x11) {
          uVar4 = zreceive(a,3);
          uVar6 = 0;
        }
        else {
          if (uVar4 != 0x10) {
            uVar4 = zreceive(a,7);
            memset(lencodes + iVar7,0,(long)(int)(uVar4 + 0xb));
            iVar7 = iVar7 + uVar4 + 0xb;
            goto LAB_0014aace;
          }
          uVar4 = zreceive(a,2);
          uVar6 = (uint)lencodes[(long)iVar7 + -1];
        }
        memset(lencodes + iVar7,uVar6,(long)(int)(uVar4 + 3));
        iVar7 = iVar7 + uVar4 + 3;
      } while( true );
    }
    if (default_distance[0x1f] == '\0') {
      for (lVar13 = 0; lVar13 != 0x90; lVar13 = lVar13 + 1) {
        default_length[lVar13] = '\b';
      }
      for (lVar13 = 0; lVar13 != 0x70; lVar13 = lVar13 + 1) {
        default_length[lVar13 + 0x90] = '\t';
      }
      for (lVar13 = 0; lVar13 != 0x18; lVar13 = lVar13 + 1) {
        default_length[lVar13 + 0x100] = '\a';
      }
      for (lVar13 = 0; lVar13 != 8; lVar13 = lVar13 + 1) {
        default_length[lVar13 + 0x118] = '\b';
      }
      for (lVar13 = 0; lVar13 != 0x20; lVar13 = lVar13 + 1) {
        default_distance[lVar13] = '\x05';
      }
    }
    iVar7 = zbuild_huffman(z,default_length,0x120);
    if (iVar7 == 0) {
      return 0;
    }
    iVar7 = zbuild_huffman(z_00,default_distance,0x20);
    if (iVar7 == 0) {
      return 0;
    }
    goto LAB_0014acad;
  }
  uVar4 = a->num_bits;
  if ((uVar4 & 7) != 0) {
    zreceive(a,uVar4 & 7);
    uVar4 = a->num_bits;
  }
  uVar9 = 0;
  while (0 < (int)uVar4) {
    uVar5 = a->code_buffer;
    lencodes[uVar9] = (uint8)uVar5;
    uVar9 = uVar9 + 1;
    a->code_buffer = uVar5 >> 8;
    uVar4 = uVar4 - 8;
    a->num_bits = uVar4;
  }
  if (uVar4 != 0) {
    __assert_fail("a->num_bits == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sidneydijkstra[P]SDEN/external/soil/src/stb_image_aug.c"
                  ,0x752,"int parse_uncompressed_block(zbuf *)");
  }
  for (; uVar9 < 4; uVar9 = uVar9 + 1) {
    puVar10 = a->zbuffer;
    if (puVar10 < a->zbuffer_end) {
      a->zbuffer = puVar10 + 1;
      uVar12 = *puVar10;
    }
    else {
      uVar12 = '\0';
    }
    lencodes[uVar9] = uVar12;
  }
  if ((lencodes._2_2_ ^ lencodes._0_2_) == 0xffff) {
    puVar10 = a->zbuffer;
    uVar9 = (ulong)(ushort)lencodes._0_2_;
    if (puVar10 + uVar9 <= a->zbuffer_end) {
      pcVar11 = a->zout;
      if (a->zout_end < pcVar11 + uVar9) {
        iVar7 = expand(a,(uint)(ushort)lencodes._0_2_);
        if (iVar7 == 0) {
          return 0;
        }
        puVar10 = a->zbuffer;
        pcVar11 = a->zout;
      }
      memcpy(pcVar11,puVar10,uVar9);
      a->zbuffer = a->zbuffer + uVar9;
      a->zout = a->zout + uVar9;
      goto LAB_0014ac47;
    }
  }
  goto LAB_0014ae45;
LAB_0014ac5d:
  if (iVar7 != iVar15) {
    failure_reason = "Corrupt PNG";
    return 0;
  }
  iVar7 = zbuild_huffman(z,lencodes,iVar14);
  if (iVar7 == 0) {
    return 0;
  }
  iVar7 = zbuild_huffman(z_00,lencodes + iVar14,uVar5 + 1);
  if (iVar7 == 0) {
    return 0;
  }
LAB_0014acad:
  while( true ) {
    while (iVar7 = zhuffman_decode(a,z), iVar7 < 0x100) {
      if (iVar7 < 0) goto LAB_0014ae45;
      pcVar11 = a->zout;
      if (a->zout_end <= pcVar11) {
        iVar14 = expand(a,1);
        if (iVar14 == 0) {
          return 0;
        }
        pcVar11 = a->zout;
      }
      a->zout = pcVar11 + 1;
      *pcVar11 = (char)iVar7;
    }
    if (iVar7 == 0x100) break;
    uVar9 = (ulong)(iVar7 - 0x101);
    iVar7 = length_base[uVar9];
    if (0xffffffffffffffeb < uVar9 - 0x1c) {
      uVar4 = zreceive(a,length_extra[uVar9]);
      iVar7 = iVar7 + uVar4;
    }
    uVar4 = zhuffman_decode(a,z_00);
    if ((int)uVar4 < 0) goto LAB_0014ae45;
    uVar9 = (ulong)uVar4;
    iVar14 = dist_base[uVar9];
    if (0xffffffffffffffe5 < uVar9 - 0x1e) {
      uVar4 = zreceive(a,dist_extra[uVar9]);
      iVar14 = iVar14 + uVar4;
    }
    pcVar11 = a->zout;
    if ((long)pcVar11 - (long)a->zout_start < (long)iVar14) goto LAB_0014ae45;
    if (a->zout_end < pcVar11 + iVar7) {
      iVar15 = expand(a,iVar7);
      if (iVar15 == 0) {
        return 0;
      }
      pcVar11 = a->zout;
    }
    for (lVar13 = 0; iVar7 != (int)lVar13; lVar13 = lVar13 + 1) {
      cVar1 = pcVar11[lVar13 - iVar14];
      pcVar2 = a->zout;
      a->zout = pcVar2 + 1;
      *pcVar2 = cVar1;
    }
  }
LAB_0014ac47:
  if (uVar3 != 0) {
    return 1;
  }
  goto LAB_0014a9b0;
}

Assistant:

static int do_zlib(zbuf *a, char *obuf, int olen, int exp, int parse_header)
{
   a->zout_start = obuf;
   a->zout       = obuf;
   a->zout_end   = obuf + olen;
   a->z_expandable = exp;

   return parse_zlib(a, parse_header);
}